

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeDouble(ParserImpl *this,double *value)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  Token *pTVar5;
  double *in_RSI;
  long in_RDI;
  double dVar6;
  string text;
  bool negative;
  undefined4 in_stack_ffffffffffffff08;
  TokenType in_stack_ffffffffffffff0c;
  ParserImpl *in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  ParserImpl *in_stack_ffffffffffffff20;
  ParserImpl *this_00;
  string local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string local_98 [16];
  uint64 in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  ParserImpl *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffffb0;
  string local_40 [24];
  Tokenizer *in_stack_ffffffffffffffd8;
  byte local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"-",(allocator *)&stack0xffffffffffffffbf);
  bVar1 = TryConsume((ParserImpl *)
                     CONCAT17(in_stack_ffffffffffffff1f,
                              CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)),
                     (string *)in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  bVar2 = LookingAtType(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (bVar2) {
    bVar2 = ConsumeUnsignedDecimalAsDouble
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                      );
    if (!bVar2) {
      local_1 = 0;
      goto LAB_0046110c;
    }
  }
  else {
    bVar2 = LookingAtType(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    if (bVar2) {
      io::Tokenizer::current((Tokenizer *)(in_RDI + 0x28));
      dVar6 = io::Tokenizer::ParseFloat(in_stack_ffffffffffffffb0);
      *in_RSI = dVar6;
      io::Tokenizer::Next(in_stack_ffffffffffffffd8);
    }
    else {
      bVar2 = LookingAtType(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      if (!bVar2) {
        io::Tokenizer::current((Tokenizer *)(in_RDI + 0x28));
        std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        ReportError(in_stack_ffffffffffffff20,
                    (string *)
                    CONCAT17(in_stack_ffffffffffffff1f,
                             CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
        std::__cxx11::string::~string(local_c0);
        local_1 = 0;
        goto LAB_0046110c;
      }
      pTVar5 = io::Tokenizer::current((Tokenizer *)(in_RDI + 0x28));
      this_00 = (ParserImpl *)&stack0xffffffffffffff88;
      std::__cxx11::string::string((string *)this_00,(string *)&pTVar5->text);
      LowerString((string *)in_stack_ffffffffffffff10);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff10,
                              (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
      ;
      if ((bVar2) ||
         (uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffff10,
                                  (char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08)), (bool)uVar3)) {
        dVar6 = std::numeric_limits<double>::infinity();
        *in_RSI = dVar6;
        io::Tokenizer::Next(in_stack_ffffffffffffffd8);
LAB_0046101c:
        bVar2 = false;
      }
      else {
        uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffff10,
                                (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
        if ((bool)uVar4) {
          dVar6 = std::numeric_limits<double>::quiet_NaN();
          *in_RSI = dVar6;
          io::Tokenizer::Next(in_stack_ffffffffffffffd8);
          goto LAB_0046101c;
        }
        std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        ReportError(this_00,(string *)CONCAT17(uVar3,CONCAT16(uVar4,in_stack_ffffffffffffff18)));
        std::__cxx11::string::~string(local_98);
        local_1 = 0;
        bVar2 = true;
      }
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
      if (bVar2) goto LAB_0046110c;
    }
  }
  if (bVar1) {
    *in_RSI = -*in_RSI;
  }
  local_1 = 1;
LAB_0046110c:
  return (bool)(local_1 & 1);
}

Assistant:

bool ConsumeDouble(double* value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
    }

    // A double can actually be an integer, according to the tokenizer.
    // Therefore, we must check both cases here.
    if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      // We have found an integer value for the double.
      DO(ConsumeUnsignedDecimalAsDouble(value, kuint64max));
    } else if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
      // We have found a float value for the double.
      *value = io::Tokenizer::ParseFloat(tokenizer_.current().text);

      // Mark the current token as consumed.
      tokenizer_.Next();
    } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      LowerString(&text);
      if (text == "inf" ||
          text == "infinity") {
        *value = std::numeric_limits<double>::infinity();
        tokenizer_.Next();
      } else if (text == "nan") {
        *value = std::numeric_limits<double>::quiet_NaN();
        tokenizer_.Next();
      } else {
        ReportError("Expected double, got: " + text);
        return false;
      }
    } else {
      ReportError("Expected double, got: " + tokenizer_.current().text);
      return false;
    }

    if (negative) {
      *value = -*value;
    }

    return true;
  }